

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManPrintMatches(Nf_Man_t *p)

{
  int iVar1;
  Nf_Mat_t *pNVar2;
  Nf_Mat_t *pNVar3;
  Nf_Mat_t *pNVar4;
  Nf_Mat_t *pNVar5;
  Mio_Cell2_t *pMVar6;
  bool bVar7;
  float fVar8;
  Nf_Mat_t *pAn;
  Nf_Mat_t *pDn;
  Nf_Mat_t *pAp;
  Nf_Mat_t *pDp;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Nf_Man_t *p_local;
  
  pDp._4_4_ = 0;
  while( true ) {
    bVar7 = false;
    if ((int)pDp._4_4_ < p->pGia->nObjs) {
      pGStack_18 = Gia_ManObj(p->pGia,pDp._4_4_);
      bVar7 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 != 0) {
      pNVar2 = Nf_ObjMatchD(p,pDp._4_4_,0);
      pNVar3 = Nf_ObjMatchA(p,pDp._4_4_,0);
      pNVar4 = Nf_ObjMatchD(p,pDp._4_4_,1);
      pNVar5 = Nf_ObjMatchA(p,pDp._4_4_,1);
      printf("%5d : ",(ulong)pDp._4_4_);
      fVar8 = Scl_Int2Flt(pNVar2->D);
      printf("Dp = %6.2f  ",(double)fVar8);
      fVar8 = Scl_Int2Flt(pNVar4->D);
      printf("Dn = %6.2f  ",(double)fVar8);
      printf("  ");
      fVar8 = Scl_Int2Flt(pNVar3->D);
      printf("Ap = %6.2f  ",(double)fVar8);
      fVar8 = Scl_Int2Flt(pNVar5->D);
      printf("An = %6.2f  ",(double)fVar8);
      printf("  ");
      pMVar6 = Nf_ManCell(p,*(uint *)pNVar2 & 0xfffff);
      printf("Dp = %8s ",pMVar6->pName);
      pMVar6 = Nf_ManCell(p,*(uint *)pNVar4 & 0xfffff);
      printf("Dn = %8s ",pMVar6->pName);
      pMVar6 = Nf_ManCell(p,*(uint *)pNVar3 & 0xfffff);
      printf("Ap = %8s ",pMVar6->pName);
      pMVar6 = Nf_ManCell(p,*(uint *)pNVar5 & 0xfffff);
      printf("An = %8s ",pMVar6->pName);
      printf("\n");
    }
    pDp._4_4_ = pDp._4_4_ + 1;
  }
  return;
}

Assistant:

void Nf_ManPrintMatches( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        Nf_Mat_t * pDp = Nf_ObjMatchD( p, i, 0 );
        Nf_Mat_t * pAp = Nf_ObjMatchA( p, i, 0 );
        Nf_Mat_t * pDn = Nf_ObjMatchD( p, i, 1 );
        Nf_Mat_t * pAn = Nf_ObjMatchA( p, i, 1 );

        printf( "%5d : ", i );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Dp = %8s ", Nf_ManCell(p, pDp->Gate)->pName );
        printf( "Dn = %8s ", Nf_ManCell(p, pDn->Gate)->pName );
        printf( "Ap = %8s ", Nf_ManCell(p, pAp->Gate)->pName );
        printf( "An = %8s ", Nf_ManCell(p, pAn->Gate)->pName );
        printf( "\n" );

    }
}